

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O0

errno_t strcpy_s(char *_Dst,size_t _SizeInBytes,char *_Src)

{
  char cVar1;
  bool bVar2;
  size_t local_38;
  size_t available;
  char *p;
  char *_Src_local;
  size_t _SizeInBytes_local;
  char *_Dst_local;
  
  if ((_Dst == (char *)0x0) || (_SizeInBytes == 0)) {
    _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
    _Dst_local._4_4_ = 0x16;
  }
  else {
    local_38 = _SizeInBytes;
    available = (size_t)_Dst;
    p = _Src;
    if (_Src == (char *)0x0) {
      *_Dst = '\0';
      if (1 < _SizeInBytes) {
        memset(_Dst + 1,0xfd,_SizeInBytes - 1);
      }
      _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
      _Dst_local._4_4_ = 0x16;
    }
    else {
      do {
        cVar1 = *p;
        *(char *)available = cVar1;
        bVar2 = false;
        if (cVar1 != '\0') {
          local_38 = local_38 - 1;
          bVar2 = local_38 != 0;
        }
        available = available + 1;
        p = p + 1;
      } while (bVar2);
      if (local_38 == 0) {
        *_Dst = '\0';
        if (1 < _SizeInBytes) {
          memset(_Dst + 1,0xfd,_SizeInBytes - 1);
        }
        _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
        _Dst_local._4_4_ = 0x22;
      }
      else {
        if ((_SizeInBytes - local_38) + 1 < _SizeInBytes) {
          memset(_Dst + (_SizeInBytes - local_38) + 1,0xfd,local_38 - 1);
        }
        _Dst_local._4_4_ = 0;
      }
    }
  }
  return _Dst_local._4_4_;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl strcpy_s(char *_Dst, size_t _SizeInBytes, const char *_Src)
{

    char *p;
    size_t available;

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInBytes);
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInBytes);

    p = _Dst;
    available = _SizeInBytes;
    while ((*p++ = *_Src++) != 0 && --available > 0)
    {
    }

    if (available == 0)
    {
       _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
       _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInBytes);
    }

    _SAFECRT__FILL_STRING(_Dst, _SizeInBytes, _SizeInBytes - available + 1);
    return 0;
}